

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_xonly_pubkey_tweak_check(void)

{
  int iVar1;
  int ecount;
  uchar tweak [32];
  int pk_parity;
  uchar buf32 [32];
  uchar output_pk32 [32];
  secp256k1_xonly_pubkey output_xonly_pk;
  secp256k1_pubkey output_pk;
  secp256k1_xonly_pubkey internal_xonly_pk;
  secp256k1_pubkey internal_pk;
  uchar sk [32];
  uchar overflows [32];
  uchar zeros64 [64];
  int *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  int iVar2;
  undefined1 local_1f8 [80];
  secp256k1_xonly_pubkey *in_stack_fffffffffffffe58;
  secp256k1_pubkey *in_stack_fffffffffffffe60;
  secp256k1_context *in_stack_fffffffffffffe68;
  secp256k1_pubkey *in_stack_fffffffffffffe70;
  secp256k1_context *in_stack_fffffffffffffe78;
  uchar *in_stack_fffffffffffffe88;
  secp256k1_xonly_pubkey *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  uchar *in_stack_fffffffffffffea0;
  secp256k1_context *in_stack_fffffffffffffea8;
  undefined1 local_148 [224];
  undefined1 local_68 [32];
  undefined1 local_48 [72];
  
  memset(local_48,0,0x40);
  set_counting_callbacks
            ((secp256k1_context *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             in_stack_fffffffffffffdf8);
  memset(local_68,0xff,0x20);
  secp256k1_testrand256((uchar *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  secp256k1_testrand256((uchar *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  iVar1 = secp256k1_ec_pubkey_create
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                     (secp256k1_pubkey *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0xfe,"test condition failed: secp256k1_ec_pubkey_create(CTX, &internal_pk, sk) == 1");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_from_pubkey
                    (in_stack_fffffffffffffe78,(secp256k1_xonly_pubkey *)in_stack_fffffffffffffe70,
                     (int *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0xff,
            "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &internal_xonly_pk, &pk_parity, &internal_pk) == 1"
           );
    abort();
  }
  iVar2 = 0;
  iVar1 = secp256k1_xonly_pubkey_tweak_add
                    (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                     (secp256k1_xonly_pubkey *)in_stack_fffffffffffffe68,
                     in_stack_fffffffffffffe60->data);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x102,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_from_pubkey
                    (in_stack_fffffffffffffe78,(secp256k1_xonly_pubkey *)in_stack_fffffffffffffe70,
                     (int *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x103,
            "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &output_xonly_pk, &pk_parity, &output_pk) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_serialize
                    (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60->data,
                     in_stack_fffffffffffffe58);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x104,
            "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, buf32, &output_xonly_pk) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_tweak_add_check
                    (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x105,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 1"
           );
    abort();
  }
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x106,"test condition failed: ecount == 0");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_tweak_add_check
                    (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x107,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 1"
           );
    abort();
  }
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x108,"test condition failed: ecount == 0");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_tweak_add_check
                    (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x109,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_tweak_add_check
                    (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x10a,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, NULL, pk_parity, &internal_xonly_pk, tweak) == 0"
           );
    abort();
  }
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x10b,"test condition failed: ecount == 1");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_tweak_add_check
                    (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x10d,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, 2, &internal_xonly_pk, tweak) == 0"
           );
    abort();
  }
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x10e,"test condition failed: ecount == 1");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_tweak_add_check
                    (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x10f,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, NULL, tweak) == 0"
           );
    abort();
  }
  if (iVar2 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x110,"test condition failed: ecount == 2");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_tweak_add_check
                    (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x111,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, NULL) == 0"
           );
    abort();
  }
  if (iVar2 != 3) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x112,"test condition failed: ecount == 3");
    abort();
  }
  memset(local_1f8,1,0x20);
  iVar1 = secp256k1_xonly_pubkey_from_pubkey
                    (in_stack_fffffffffffffe78,(secp256k1_xonly_pubkey *)in_stack_fffffffffffffe70,
                     (int *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x115,
            "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &internal_xonly_pk, NULL, &internal_pk) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_tweak_add
                    (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                     (secp256k1_xonly_pubkey *)in_stack_fffffffffffffe68,
                     in_stack_fffffffffffffe60->data);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x116,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_from_pubkey
                    (in_stack_fffffffffffffe78,(secp256k1_xonly_pubkey *)in_stack_fffffffffffffe70,
                     (int *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x117,
            "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &output_xonly_pk, &pk_parity, &output_pk) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_serialize
                    (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60->data,
                     in_stack_fffffffffffffe58);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x118,
            "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, output_pk32, &output_xonly_pk) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_tweak_add_check
                    (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x119,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, output_pk32, pk_parity, &internal_xonly_pk, tweak) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_tweak_add_check
                    (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x11c,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, output_pk32, !pk_parity, &internal_xonly_pk, tweak) == 0"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_serialize
                    (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60->data,
                     in_stack_fffffffffffffe58);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x11e,
            "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, buf32, &internal_xonly_pk) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_tweak_add_check
                    (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x11f,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 0"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_tweak_add_check
                    (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x122,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, output_pk32, pk_parity, &internal_xonly_pk, overflows) == 0"
           );
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_tweak_add
                    (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                     (secp256k1_xonly_pubkey *)in_stack_fffffffffffffe68,
                     in_stack_fffffffffffffe60->data);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x123,
            "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, overflows) == 0"
           );
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_148,local_48,0x40);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x124,
            "test condition failed: secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0"
           );
    abort();
  }
  if (iVar2 != 3) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x125,"test condition failed: ecount == 3");
    abort();
  }
  return;
}

Assistant:

static void test_xonly_pubkey_tweak_check(void) {
    unsigned char zeros64[64] = { 0 };
    unsigned char overflows[32];
    unsigned char sk[32];
    secp256k1_pubkey internal_pk;
    secp256k1_xonly_pubkey internal_xonly_pk;
    secp256k1_pubkey output_pk;
    secp256k1_xonly_pubkey output_xonly_pk;
    unsigned char output_pk32[32];
    unsigned char buf32[32];
    int pk_parity;
    unsigned char tweak[32];

    int ecount;

    set_counting_callbacks(CTX, &ecount);

    memset(overflows, 0xff, sizeof(overflows));
    secp256k1_testrand256(tweak);
    secp256k1_testrand256(sk);
    CHECK(secp256k1_ec_pubkey_create(CTX, &internal_pk, sk) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &internal_xonly_pk, &pk_parity, &internal_pk) == 1);

    ecount = 0;
    CHECK(secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &output_xonly_pk, &pk_parity, &output_pk) == 1);
    CHECK(secp256k1_xonly_pubkey_serialize(CTX, buf32, &output_xonly_pk) == 1);
    CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 1);
    CHECK(ecount == 0);
    CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 1);
    CHECK(ecount == 0);
    CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 1);
    CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, NULL, pk_parity, &internal_xonly_pk, tweak) == 0);
    CHECK(ecount == 1);
    /* invalid pk_parity value */
    CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, 2, &internal_xonly_pk, tweak) == 0);
    CHECK(ecount == 1);
    CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, NULL, tweak) == 0);
    CHECK(ecount == 2);
    CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, NULL) == 0);
    CHECK(ecount == 3);

    memset(tweak, 1, sizeof(tweak));
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &internal_xonly_pk, NULL, &internal_pk) == 1);
    CHECK(secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &output_xonly_pk, &pk_parity, &output_pk) == 1);
    CHECK(secp256k1_xonly_pubkey_serialize(CTX, output_pk32, &output_xonly_pk) == 1);
    CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, output_pk32, pk_parity, &internal_xonly_pk, tweak) == 1);

    /* Wrong pk_parity */
    CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, output_pk32, !pk_parity, &internal_xonly_pk, tweak) == 0);
    /* Wrong public key */
    CHECK(secp256k1_xonly_pubkey_serialize(CTX, buf32, &internal_xonly_pk) == 1);
    CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 0);

    /* Overflowing tweak not allowed */
    CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, output_pk32, pk_parity, &internal_xonly_pk, overflows) == 0);
    CHECK(secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, overflows) == 0);
    CHECK(secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0);
    CHECK(ecount == 3);
}